

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCompositeDeepScanLine.cpp
# Opt level: O2

void __thiscall
Imf_3_4::CompositeDeepScanLine::readPixels(CompositeDeepScanLine *this,int start,int end)

{
  int *piVar1;
  long *plVar2;
  pointer ppDVar3;
  pointer ppDVar4;
  pointer puVar5;
  Header *pHVar6;
  Data *pDVar7;
  Task *this_00;
  ArgExc *this_01;
  size_t pixel;
  size_type sVar8;
  size_t j_1;
  long lVar9;
  int iVar10;
  size_t channel;
  pointer pvVar11;
  ulong uVar12;
  Header *in_R8;
  ulong uVar13;
  size_type __n;
  size_t j;
  ulong uVar14;
  long lVar15;
  size_type __new_size;
  bool bVar16;
  TaskGroup g;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  samples;
  vector<const_char_*,_std::allocator<const_char_*>_> names;
  vector<unsigned_int,_std::allocator<unsigned_int>_> total_sizes;
  vector<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>,_std::allocator<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>_>_>
  pointers;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  counts;
  vector<unsigned_int,_std::allocator<unsigned_int>_> num_sources;
  vector<const_Imf_3_4::Header_*,_std::allocator<const_Imf_3_4::Header_*>_> headers;
  vector<Imf_3_4::DeepFrameBuffer,_std::allocator<Imf_3_4::DeepFrameBuffer>_> framebuffers;
  
  pDVar7 = this->_Data;
  uVar13 = ((long)(pDVar7->_part).
                  super__Vector_base<Imf_3_4::DeepScanLineInputPart_*,_std::allocator<Imf_3_4::DeepScanLineInputPart_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(pDVar7->_part).
                  super__Vector_base<Imf_3_4::DeepScanLineInputPart_*,_std::allocator<Imf_3_4::DeepScanLineInputPart_*>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3) +
           ((long)(pDVar7->_file).
                  super__Vector_base<Imf_3_4::DeepScanLineInputFile_*,_std::allocator<Imf_3_4::DeepScanLineInputFile_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(pDVar7->_file).
                  super__Vector_base<Imf_3_4::DeepScanLineInputFile_*,_std::allocator<Imf_3_4::DeepScanLineInputFile_*>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3);
  std::vector<Imf_3_4::DeepFrameBuffer,_std::allocator<Imf_3_4::DeepFrameBuffer>_>::vector
            (&framebuffers,uVar13,(allocator_type *)&counts);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector(&counts,uVar13,(allocator_type *)&pointers);
  std::
  vector<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>,_std::allocator<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>_>_>
  ::vector(&pointers,uVar13,(allocator_type *)&headers);
  std::vector<const_Imf_3_4::Header_*,_std::allocator<const_Imf_3_4::Header_*>_>::vector
            (&headers,uVar13,(allocator_type *)&total_sizes);
  lVar9 = 0;
  uVar14 = 0;
  while( true ) {
    pDVar7 = this->_Data;
    ppDVar3 = (pDVar7->_file).
              super__Vector_base<Imf_3_4::DeepScanLineInputFile_*,_std::allocator<Imf_3_4::DeepScanLineInputFile_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(pDVar7->_file).
                      super__Vector_base<Imf_3_4::DeepScanLineInputFile_*,_std::allocator<Imf_3_4::DeepScanLineInputFile_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppDVar3 >> 3) <= uVar14)
    break;
    pHVar6 = DeepScanLineInputFile::header(*(DeepScanLineInputFile **)((long)ppDVar3 + lVar9));
    *(Header **)
     ((long)headers.
            super__Vector_base<const_Imf_3_4::Header_*,_std::allocator<const_Imf_3_4::Header_*>_>.
            _M_impl.super__Vector_impl_data._M_start + lVar9) = pHVar6;
    uVar14 = uVar14 + 1;
    lVar9 = lVar9 + 8;
  }
  for (uVar14 = 0;
      ppDVar4 = (pDVar7->_part).
                super__Vector_base<Imf_3_4::DeepScanLineInputPart_*,_std::allocator<Imf_3_4::DeepScanLineInputPart_*>_>
                ._M_impl.super__Vector_impl_data._M_start,
      uVar14 < (ulong)((long)(pDVar7->_part).
                             super__Vector_base<Imf_3_4::DeepScanLineInputPart_*,_std::allocator<Imf_3_4::DeepScanLineInputPart_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)ppDVar4 >> 3);
      uVar14 = uVar14 + 1) {
    pHVar6 = DeepScanLineInputPart::header(ppDVar4[uVar14]);
    *(Header **)
     ((long)headers.
            super__Vector_base<const_Imf_3_4::Header_*,_std::allocator<const_Imf_3_4::Header_*>_>.
            _M_impl.super__Vector_impl_data._M_start + lVar9) = pHVar6;
    pDVar7 = this->_Data;
    lVar9 = lVar9 + 8;
  }
  lVar9 = 0;
  lVar15 = 0;
  uVar14 = uVar13;
  while (bVar16 = uVar14 != 0, uVar14 = uVar14 - 1, bVar16) {
    Data::handleDeepFrameBuffer
              (this->_Data,
               (DeepFrameBuffer *)
               (&((framebuffers.
                   super__Vector_base<Imf_3_4::DeepFrameBuffer,_std::allocator<Imf_3_4::DeepFrameBuffer>_>
                   ._M_impl.super__Vector_impl_data._M_start)->_map)._M_t._M_impl.field_0x0 + lVar9)
               ,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                ((long)&((counts.
                          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                        super__Vector_impl_data._M_start + lVar15),
               (vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>
                *)((long)&((pointers.
                            super__Vector_base<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>,_std::allocator<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super__Vector_base<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + lVar15),in_R8,start,end);
    lVar15 = lVar15 + 0x18;
    lVar9 = lVar9 + 0x68;
  }
  lVar9 = 0;
  uVar14 = 0;
  while( true ) {
    pDVar7 = this->_Data;
    ppDVar3 = (pDVar7->_file).
              super__Vector_base<Imf_3_4::DeepScanLineInputFile_*,_std::allocator<Imf_3_4::DeepScanLineInputFile_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(pDVar7->_file).
                      super__Vector_base<Imf_3_4::DeepScanLineInputFile_*,_std::allocator<Imf_3_4::DeepScanLineInputFile_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppDVar3 >> 3) <= uVar14)
    break;
    DeepScanLineInputFile::setFrameBuffer
              (ppDVar3[uVar14],
               (DeepFrameBuffer *)
               (&((framebuffers.
                   super__Vector_base<Imf_3_4::DeepFrameBuffer,_std::allocator<Imf_3_4::DeepFrameBuffer>_>
                   ._M_impl.super__Vector_impl_data._M_start)->_map)._M_t._M_impl.field_0x0 + lVar9)
              );
    DeepScanLineInputFile::readPixelSampleCounts
              ((this->_Data->_file).
               super__Vector_base<Imf_3_4::DeepScanLineInputFile_*,_std::allocator<Imf_3_4::DeepScanLineInputFile_*>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar14],start,end);
    uVar14 = uVar14 + 1;
    lVar9 = lVar9 + 0x68;
  }
  for (uVar14 = 0;
      ppDVar4 = (pDVar7->_part).
                super__Vector_base<Imf_3_4::DeepScanLineInputPart_*,_std::allocator<Imf_3_4::DeepScanLineInputPart_*>_>
                ._M_impl.super__Vector_impl_data._M_start,
      uVar14 < (ulong)((long)(pDVar7->_part).
                             super__Vector_base<Imf_3_4::DeepScanLineInputPart_*,_std::allocator<Imf_3_4::DeepScanLineInputPart_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)ppDVar4 >> 3);
      uVar14 = uVar14 + 1) {
    DeepScanLineInputPart::setFrameBuffer
              (ppDVar4[uVar14],
               (DeepFrameBuffer *)
               (&((framebuffers.
                   super__Vector_base<Imf_3_4::DeepFrameBuffer,_std::allocator<Imf_3_4::DeepFrameBuffer>_>
                   ._M_impl.super__Vector_impl_data._M_start)->_map)._M_t._M_impl.field_0x0 + lVar9)
              );
    DeepScanLineInputPart::readPixelSampleCounts
              ((this->_Data->_part).
               super__Vector_base<Imf_3_4::DeepScanLineInputPart_*,_std::allocator<Imf_3_4::DeepScanLineInputPart_*>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar14],start,end);
    pDVar7 = this->_Data;
    lVar9 = lVar9 + 0x68;
  }
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::size((Box<Imath_3_2::Vec2<int>_> *)&total_sizes);
  __n = (long)((end - start) + 1) *
        ((long)(int)total_sizes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start + 1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&total_sizes,__n,(allocator_type *)&num_sources);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&num_sources,__n,(allocator_type *)&samples);
  lVar9 = CONCAT44(total_sizes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start._4_4_,
                   (int)total_sizes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start);
  __new_size = 0;
  for (sVar8 = 0; sVar8 != __n; sVar8 = sVar8 + 1) {
    *(undefined4 *)(lVar9 + sVar8 * 4) = 0;
    num_sources.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start[sVar8] = 0;
    pvVar11 = counts.
              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar14 = uVar13;
    while (bVar16 = uVar14 != 0, uVar14 = uVar14 - 1, bVar16) {
      puVar5 = (pvVar11->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      piVar1 = (int *)(lVar9 + sVar8 * 4);
      *piVar1 = *piVar1 + puVar5[sVar8];
      if (puVar5[sVar8] != 0) {
        num_sources.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[sVar8] =
             num_sources.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start[sVar8] + 1;
      }
      pvVar11 = pvVar11 + 1;
    }
    __new_size = __new_size + *(uint *)(lVar9 + sVar8 * 4);
  }
  if ((0 < (anonymous_namespace)::maximumSampleCount) &&
     ((anonymous_namespace)::maximumSampleCount < (long)__new_size)) {
    this_01 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc
              (this_01,
               "Cannot composite scanline: total sample count on scanline exceeds limit set by CompositeDeepScanLine::setMaximumSampleCount()"
              );
    __cxa_throw(this_01,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::vector(&samples,(long)(this->_Data->_channels).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->_Data->_channels).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5,(allocator_type *)&names);
  lVar9 = 0;
  for (uVar14 = 0; pDVar7 = this->_Data,
      uVar14 < (ulong)((long)(pDVar7->_channels).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(pDVar7->_channels).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 5); uVar14 = uVar14 + 1) {
    if ((uVar14 != 1) || (pDVar7->_zback == true)) {
      std::vector<float,_std::allocator<float>_>::resize
                ((vector<float,_std::allocator<float>_> *)
                 ((long)&((samples.
                           super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                         super__Vector_impl_data._M_start + lVar9),__new_size);
    }
    lVar9 = lVar9 + 0x18;
  }
  uVar14 = 0;
  while( true ) {
    if ((ulong)(((long)samples.
                       super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)samples.
                      super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x18) <= uVar14) break;
    if ((uVar14 != 1) || (this->_Data->_zback == true)) {
      std::vector<float,_std::allocator<float>_>::resize
                (samples.
                 super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar14,__new_size);
      lVar9 = 0;
      for (sVar8 = 0; sVar8 != __n; sVar8 = sVar8 + 1) {
        lVar15 = 0;
        uVar12 = 0;
        for (; (uVar12 < uVar13 && (lVar9 < (long)__new_size));
            lVar9 = lVar9 + (ulong)*(uint *)(*plVar2 + sVar8 * 4)) {
          *(pointer *)
           (*(long *)(*(long *)((long)&((pointers.
                                         super__Vector_base<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>,_std::allocator<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->
                                       super__Vector_base<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start + lVar15) +
                     uVar14 * 0x18) + sVar8 * 8) =
               samples.
               super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar14].
               super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
               _M_start + lVar9;
          plVar2 = (long *)((long)&((counts.
                                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                   _M_impl.super__Vector_impl_data._M_start + lVar15);
          uVar12 = uVar12 + 1;
          lVar15 = lVar15 + 0x18;
        }
      }
    }
    uVar14 = uVar14 + 1;
  }
  uVar13 = 0;
  while( true ) {
    pDVar7 = this->_Data;
    ppDVar3 = (pDVar7->_file).
              super__Vector_base<Imf_3_4::DeepScanLineInputFile_*,_std::allocator<Imf_3_4::DeepScanLineInputFile_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(pDVar7->_file).
                      super__Vector_base<Imf_3_4::DeepScanLineInputFile_*,_std::allocator<Imf_3_4::DeepScanLineInputFile_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppDVar3 >> 3) <= uVar13)
    break;
    DeepScanLineInputFile::readPixels(ppDVar3[uVar13],start,end);
    uVar13 = uVar13 + 1;
  }
  for (uVar13 = 0;
      ppDVar4 = (pDVar7->_part).
                super__Vector_base<Imf_3_4::DeepScanLineInputPart_*,_std::allocator<Imf_3_4::DeepScanLineInputPart_*>_>
                ._M_impl.super__Vector_impl_data._M_start,
      uVar13 < (ulong)((long)(pDVar7->_part).
                             super__Vector_base<Imf_3_4::DeepScanLineInputPart_*,_std::allocator<Imf_3_4::DeepScanLineInputPart_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)ppDVar4 >> 3);
      uVar13 = uVar13 + 1) {
    DeepScanLineInputPart::readPixels(ppDVar4[uVar13],start,end);
    pDVar7 = this->_Data;
  }
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            (&names,(long)(pDVar7->_channels).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(pDVar7->_channels).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5,(allocator_type *)&g);
  lVar9 = 0;
  uVar13 = 0;
  while( true ) {
    if ((ulong)((long)names.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)names.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) <= uVar13) break;
    *(undefined8 *)
     ((long)names.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_start + lVar9) =
         *(undefined8 *)
          ((long)&(((this->_Data->_channels).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar9 * 4);
    uVar13 = uVar13 + 1;
    lVar9 = lVar9 + 8;
  }
  if (this->_Data->_zback == false) {
    names.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_start[1] =
         *names.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_start;
  }
  IlmThread_3_4::TaskGroup::TaskGroup(&g);
  for (iVar10 = start; iVar10 <= end; iVar10 = iVar10 + 1) {
    this_00 = (Task *)operator_new(0x40);
    pDVar7 = this->_Data;
    IlmThread_3_4::Task::Task(this_00,&g);
    *(undefined ***)this_00 = &PTR__Task_001e2ec8;
    *(Data **)(this_00 + 0x10) = pDVar7;
    *(int *)(this_00 + 0x18) = iVar10;
    *(int *)(this_00 + 0x1c) = start;
    *(vector<const_char_*,_std::allocator<const_char_*>_> **)(this_00 + 0x20) = &names;
    *(vector<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>,_std::allocator<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>_>_>
      **)(this_00 + 0x28) = &pointers;
    *(vector<unsigned_int,_std::allocator<unsigned_int>_> **)(this_00 + 0x30) = &total_sizes;
    *(vector<unsigned_int,_std::allocator<unsigned_int>_> **)(this_00 + 0x38) = &num_sources;
    IlmThread_3_4::ThreadPool::addGlobalTask(this_00);
  }
  IlmThread_3_4::TaskGroup::~TaskGroup(&g);
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
            (&names.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector(&samples);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&num_sources.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&total_sizes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<const_Imf_3_4::Header_*,_std::allocator<const_Imf_3_4::Header_*>_>::
  ~_Vector_base(&headers.
                 super__Vector_base<const_Imf_3_4::Header_*,_std::allocator<const_Imf_3_4::Header_*>_>
               );
  std::
  vector<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>,_std::allocator<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>_>_>
  ::~vector(&pointers);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&counts);
  std::vector<Imf_3_4::DeepFrameBuffer,_std::allocator<Imf_3_4::DeepFrameBuffer>_>::~vector
            (&framebuffers);
  return;
}

Assistant:

void
CompositeDeepScanLine::readPixels (int start, int end)
{
    size_t parts =
        _Data->_file.size () + _Data->_part.size (); // total of files+parts

    vector<DeepFrameBuffer>      framebuffers (parts);
    vector<vector<unsigned int>> counts (parts);

    //
    // for each part, a pointer to an array of channels
    //
    vector<vector<vector<float*>>> pointers (parts);
    vector<const Header*>          headers (parts);

    {
        size_t i;
        for (i = 0; i < _Data->_file.size (); i++)
        {
            headers[i] = &_Data->_file[i]->header ();
        }

        for (size_t j = 0; j < _Data->_part.size (); j++)
        {
            headers[i + j] = &_Data->_part[j]->header ();
        }
    }

    for (size_t i = 0; i < parts; i++)
    {
        _Data->handleDeepFrameBuffer (
            framebuffers[i], counts[i], pointers[i], *headers[i], start, end);
    }

    //
    // set frame buffers and read scanlines from all parts
    // TODO what happens if SCANLINE not in data window?
    //

    {
        size_t i = 0;
        for (i = 0; i < _Data->_file.size (); i++)
        {
            _Data->_file[i]->setFrameBuffer (framebuffers[i]);
            _Data->_file[i]->readPixelSampleCounts (start, end);
        }
        for (size_t j = 0; j < _Data->_part.size (); j++)
        {
            _Data->_part[j]->setFrameBuffer (framebuffers[i + j]);
            _Data->_part[j]->readPixelSampleCounts (start, end);
        }
    }

    //
    //  total width
    //

    size_t               total_width  = _Data->_dataWindow.size ().x + 1;
    size_t               total_pixels = total_width * (end - start + 1);
    vector<unsigned int> total_sizes (total_pixels);
    vector<unsigned int> num_sources (
        total_pixels); //number of parts with non-zero sample count

    int64_t overall_sample_count =
        0; // sum of all samples in all images between start and end

    //
    // accumulate pixel counts
    //
    for (size_t ptr = 0; ptr < total_pixels; ptr++)
    {
        total_sizes[ptr] = 0;
        num_sources[ptr] = 0;
        for (size_t j = 0; j < parts; j++)
        {
            total_sizes[ptr] += counts[j][ptr];
            if (counts[j][ptr] > 0) num_sources[ptr]++;
        }
        overall_sample_count += total_sizes[ptr];
    }

    if (maximumSampleCount > 0 && overall_sample_count > maximumSampleCount)
    {
        throw IEX_NAMESPACE::ArgExc (
            "Cannot composite scanline: total sample count on scanline exceeds "
            "limit set by CompositeDeepScanLine::setMaximumSampleCount()");
    }

    //
    // allocate arrays for pixel data
    // samples array accessed as in pixels[channel][sample]
    //

    vector<vector<float>> samples (_Data->_channels.size ());

    for (size_t channel = 0; channel < _Data->_channels.size (); channel++)
    {
        if (channel != 1 || _Data->_zback)
        {
            samples[channel].resize (overall_sample_count);
        }
    }

    for (size_t channel = 0; channel < samples.size (); channel++)
    {

        if (channel != 1 || _Data->_zback)
        {

            samples[channel].resize (overall_sample_count);

            //
            // allocate pointers for channel data
            //

            int64_t offset = 0;

            for (size_t pixel = 0; pixel < total_pixels; pixel++)
            {
                for (size_t part = 0;
                     part < parts && offset < overall_sample_count;
                     part++)
                {
                    pointers[part][channel][pixel] = &samples[channel][offset];
                    offset += counts[part][pixel];
                }
            }
        }
    }

    //
    // read data
    //

    for (size_t i = 0; i < _Data->_file.size (); i++)
    {
        _Data->_file[i]->readPixels (start, end);
    }
    for (size_t j = 0; j < _Data->_part.size (); j++)
    {
        _Data->_part[j]->readPixels (start, end);
    }

    //
    // composite pixels and write back to framebuffer
    //

    // turn vector of strings into array of char *
    // and make sure 'ZBack' channel is correct
    vector<const char*> names (_Data->_channels.size ());
    for (size_t i = 0; i < names.size (); i++)
    {
        names[i] = _Data->_channels[i].c_str ();
    }

    if (!_Data->_zback)
        names[1] = names[0]; // no zback channel, so make it point to z

    TaskGroup g;
    for (int y = start; y <= end; y++)
    {
        ThreadPool::addGlobalTask (new LineCompositeTask (
            &g,
            _Data,
            y,
            start,
            &names,
            &pointers,
            &total_sizes,
            &num_sources));
    } //next row
}